

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interlace.c
# Opt level: O0

IceTBoolean CompareImageColors(IceTImage image_a,IceTImage image_b)

{
  IceTEnum IVar1;
  IceTEnum IVar2;
  IceTSizeType IVar3;
  IceTSizeType IVar4;
  IceTUByte *color_buffer;
  IceTUByte *color_buffer_00;
  uint local_50;
  uint local_4c;
  IceTSizeType y;
  IceTSizeType x;
  IceTUByte *data_b_start;
  IceTUByte *data_a_start;
  IceTUByte *data_b;
  IceTUByte *data_a;
  IceTSizeType height;
  IceTSizeType width;
  IceTImage image_b_local;
  IceTImage image_a_local;
  
  IVar1 = icetImageGetColorFormat(image_a);
  IVar2 = icetImageGetColorFormat(image_b);
  if (IVar1 == IVar2) {
    IVar3 = icetImageGetWidth(image_a);
    IVar4 = icetImageGetWidth(image_b);
    if (IVar3 == IVar4) {
      IVar3 = icetImageGetHeight(image_a);
      IVar4 = icetImageGetHeight(image_b);
      if (IVar3 == IVar4) {
        IVar1 = icetImageGetColorFormat(image_a);
        if (IVar1 == 0xc000) {
          return '\x01';
        }
        IVar3 = icetImageGetWidth(image_a);
        IVar4 = icetImageGetHeight(image_a);
        color_buffer = (IceTUByte *)malloc((long)(IVar3 * IVar4 * 4));
        icetImageCopyColorub(image_a,color_buffer,0xc001);
        color_buffer_00 = (IceTUByte *)malloc((long)(IVar3 * IVar4 * 4));
        icetImageCopyColorub(image_b,color_buffer_00,0xc001);
        local_50 = 0;
        data_a_start = color_buffer_00;
        data_b = color_buffer;
        do {
          if (IVar4 <= (int)local_50) {
            free(color_buffer);
            free(color_buffer_00);
            return '\x01';
          }
          for (local_4c = 0; (int)local_4c < IVar3; local_4c = local_4c + 1) {
            if ((((*data_b != *data_a_start) || (data_b[1] != data_a_start[1])) ||
                (data_b[2] != data_a_start[2])) || (data_b[3] != data_a_start[3])) {
              printf("ERROR: Encountered bad pixel @ (%d,%d).\n",(ulong)local_4c,(ulong)local_50);
              printf("Expected (%d, %d, %d, %d)\n",(ulong)*data_b,(ulong)data_b[1],(ulong)data_b[2],
                     (ulong)data_b[3]);
              printf("Got (%d, %d, %d, %d)\n",(ulong)*data_a_start,(ulong)data_a_start[1],
                     (ulong)data_a_start[2],(ulong)data_a_start[3]);
              return '\0';
            }
            data_b = data_b + 4;
            data_a_start = data_a_start + 4;
          }
          local_50 = local_50 + 1;
        } while( true );
      }
    }
    printf("ERROR: Images have different dimensions.\n");
  }
  else {
    printf("ERROR: Image formats do not match.\n");
  }
  return '\0';
}

Assistant:

static IceTBoolean CompareImageColors(const IceTImage image_a,
                                      const IceTImage image_b)
{
    IceTSizeType width;
    IceTSizeType height;
    IceTUByte *data_a;
    IceTUByte *data_b;
    IceTUByte *data_a_start;
    IceTUByte *data_b_start;
    IceTSizeType x;
    IceTSizeType y;

    if (icetImageGetColorFormat(image_a) != icetImageGetColorFormat(image_b)) {
        printf("ERROR: Image formats do not match.\n");
        return ICET_FALSE;
    }

    if (   (icetImageGetWidth(image_a) != icetImageGetWidth(image_b))
        || (icetImageGetHeight(image_a) != icetImageGetHeight(image_b)) ) {
        printf("ERROR: Images have different dimensions.\n");
        return ICET_FALSE;
    }

    if (icetImageGetColorFormat(image_a) == ICET_IMAGE_COLOR_NONE) {
        /* No color data, trivially the same. */
        return ICET_TRUE;
    }

    width = icetImageGetWidth(image_a);
    height = icetImageGetHeight(image_a);

    data_a = data_a_start = malloc(width*height*4);
    icetImageCopyColorub(image_a, data_a, ICET_IMAGE_COLOR_RGBA_UBYTE);

    data_b = data_b_start = malloc(width*height*4);
    icetImageCopyColorub(image_b, data_b, ICET_IMAGE_COLOR_RGBA_UBYTE);

    for (y = 0; y < height; y++) {
        for (x = 0; x < width; x++) {
            if (   (data_a[0] != data_b[0])
                || (data_a[1] != data_b[1])
                || (data_a[2] != data_b[2])
                || (data_a[3] != data_b[3]) ) {
                printf("ERROR: Encountered bad pixel @ (%d,%d).\n", x, y);
                printf("Expected (%d, %d, %d, %d)\n",
                       data_a[0], data_a[1], data_a[2], data_a[3]);
                printf("Got (%d, %d, %d, %d)\n",
                       data_b[0], data_b[1], data_b[2], data_b[3]);
                return ICET_FALSE;
            }
            data_a += 4;
            data_b += 4;
        }
    }

    free(data_a_start);
    free(data_b_start);

    return ICET_TRUE;
}